

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::LoadLocal(VirtualMachine *this)

{
  element_type *peVar1;
  size_t __n;
  reference pvVar2;
  Variable v;
  string local_58;
  undefined1 local_38 [8];
  shared_ptr<runtime::StackFrame> stackFrame;
  
  if ((this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"No stack frame found in LoadLocal",(allocator<char> *)local_38);
    panic(this,&local_58);
  }
  std::__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2> *)local_38,
             &(this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>
            );
  __n = getByteCodeParameter(this);
  if (__n < (ulong)((long)(((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                           ((long)local_38 + 8))->
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                           ((long)local_38 + 8))->
                          super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pvVar2 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                       ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)
                        ((long)local_38 + 8),__n);
    v._4_4_ = 0;
    v.type = pvVar2->type;
    v.field_1.integerValue = (pvVar2->field_1).integerValue;
    pushOpStack(this,v);
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stackFrame);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Index out of bounds in LoadLocal",
             (allocator<char> *)
             ((long)&stackFrame.super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  panic(this,&local_58);
}

Assistant:

void runtime::VirtualMachine::LoadLocal() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in LoadLocal");
    return;
  }

  auto stackFrame = this->stackFrame;

  auto locals = &stackFrame->locals;

  auto index = this->getByteCodeParameter();

  if (index >= locals->size()) {
    this->panic("Index out of bounds in LoadLocal");
    return;
  }

  Variable local = locals->at(index);

  this->pushOpStack(local);

  this->advance();
}